

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O1

void __thiscall Nova::Example<float,_2>::Write_Frame_Title(Example<float,_2> *this,int frame)

{
  undefined8 *puVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  ostream *poVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __val;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  if (this->write_frame_title != true) {
    return;
  }
  pcVar2 = (this->output_directory)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->output_directory)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __val = -frame;
  if (0 < frame) {
    __val = frame;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0012bb6f;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0012bb6f;
      }
      if (uVar7 < 10000) goto LAB_0012bb6f;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0012bb6f:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)(frame >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)frame >> 0x1f) + (long)local_90),__len,__val);
  uVar9 = 0xf;
  if (local_70 != local_60) {
    uVar9 = local_60[0];
  }
  if (uVar9 < (ulong)(local_88 + local_68)) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_0012bbfd;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_0012bbfd:
  local_b0 = &local_a0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50.field_2._8_8_ = plVar5[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_50._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar6 = File_Utilities::Safe_Open_Output(&local_50,false);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(this->frame_title)._M_dataplus._M_p,(this->frame_title)._M_string_length);
  (**(code **)(*(long *)poVar6 + 8))(poVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void Example<T,d>::
Write_Frame_Title(const int frame) const
{
    if(write_frame_title) File_Utilities::Write_To_Text_File(output_directory+"/"+std::to_string(frame)+"/frame_title",frame_title);
}